

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

void __thiscall
wallet::SelectionResult::AddInputs
          (SelectionResult *this,
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs,bool subtract_fee_outputs)

{
  long lVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InsertInputs<std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
            (this,inputs);
  this->m_use_effective = !subtract_fee_outputs;
  p_Var2 = (inputs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(inputs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var4) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      iVar3 = *(int *)(*(long *)(p_Var2 + 1) + 0x74);
      if (*(int *)(*(long *)(p_Var2 + 1) + 0x74) < 1) {
        iVar3 = 0;
      }
      iVar5 = iVar5 + iVar3 * 4;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  this->m_weight = this->m_weight + iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SelectionResult::AddInputs(const std::set<std::shared_ptr<COutput>>& inputs, bool subtract_fee_outputs)
{
    // As it can fail, combine inputs first
    InsertInputs(inputs);
    m_use_effective = !subtract_fee_outputs;

    m_weight += std::accumulate(inputs.cbegin(), inputs.cend(), 0, [](int sum, const auto& coin) {
        return sum + std::max(coin->input_bytes, 0) * WITNESS_SCALE_FACTOR;
    });
}